

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__write_int(int fd,int val)

{
  ssize_t sVar1;
  int *piVar2;
  int val_local;
  
  val_local = val;
  do {
    sVar1 = write(fd,&val_local,4);
    if (sVar1 != -1) {
      if (sVar1 == 4) {
        return;
      }
      goto LAB_001134fc;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 == 0x20) {
    return;
  }
LAB_001134fc:
  __assert_fail("n == sizeof(val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                ,0x102,"void uv__write_int(int, int)");
}

Assistant:

static void uv__write_int(int fd, int val) {
  ssize_t n;

  do
    n = write(fd, &val, sizeof(val));
  while (n == -1 && errno == EINTR);

  if (n == -1 && errno == EPIPE)
    return; /* parent process has quit */

  assert(n == sizeof(val));
}